

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O3

void __thiscall qpdf::Tokenizer::findEI(Tokenizer *this,InputSource *input)

{
  size_t i;
  byte bVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar10;
  string *context;
  size_type sVar11;
  uint uVar12;
  type ii;
  QPDFWordTokenFinder f;
  Tokenizer check;
  Finder local_128;
  InputSource *local_120;
  long *local_118 [2];
  long local_108 [2];
  qpdf_offset_t local_f8;
  Tokenizer *local_f0;
  long *local_e8 [2];
  long local_d8 [2];
  _Alloc_hider *local_c8;
  token_type_e local_c0;
  undefined4 uStack_bc;
  _Alloc_hider local_b8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68 [3];
  
  local_f0 = this;
  local_f8 = InputSource::getLastOffset(input);
  iVar8 = (*input->_vptr_InputSource[4])(input);
  bVar7 = false;
  do {
    if (bVar7) break;
    local_c8 = local_b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"EI","");
    local_128._vptr_Finder = (_func_int **)&PTR__QPDFWordTokenFinder_002ee160;
    local_118[0] = local_108;
    local_120 = input;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_118,local_c8,(long)&local_c8->_M_p + CONCAT44(uStack_bc,local_c0));
    if (local_c8 != local_b8) {
      operator_delete(local_c8,(ulong)(local_b8[0]._M_p + 1));
    }
    iVar9 = (*input->_vptr_InputSource[4])(input);
    bVar6 = InputSource::findFirst(input,"EI",CONCAT44(extraout_var_00,iVar9),0,&local_128);
    if (bVar6) {
      iVar9 = (*input->_vptr_InputSource[4])(input);
      lVar10 = CONCAT44(extraout_var_01,iVar9) - CONCAT44(extraout_var,iVar8);
      i = lVar10 - 2;
      if (lVar10 < 2) {
        QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error(i);
      }
      local_f0->inline_image_bytes = i;
      Tokenizer((Tokenizer *)&local_c8);
      uVar12 = 0;
      do {
        local_e8[0] = local_d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"checker","");
        nextToken((Tokenizer *)&local_c8,input,context,0);
        if (local_e8[0] != local_d8) {
          operator_delete(local_e8[0],local_d8[0] + 1);
        }
        if (local_c0 == tt_word) {
          if (local_90 != 0) {
            sVar11 = 0;
            bVar3 = 0;
            bVar5 = 0;
            do {
              bVar1 = local_98._M_p[sVar11];
              bVar4 = 1;
              if ((((0x19 < (byte)(bVar1 + 0x9f)) && (bVar1 != 0x2a && 0x19 < (byte)(bVar1 + 0xbf)))
                  && (bVar3 = 1, bVar4 = bVar5, (char)bVar1 < ' ')) &&
                 ((4 < bVar1 - 9 && (bVar1 != 0)))) goto LAB_001e2786;
              sVar11 = sVar11 + 1;
              bVar5 = bVar4;
            } while (local_90 != sVar11);
            if ((bool)(bVar4 & bVar3)) goto LAB_001e2786;
          }
        }
        else {
          if (local_c0 == tt_bad) goto LAB_001e2786;
          if (local_c0 == tt_eof) break;
        }
        bVar2 = uVar12 < 9;
        uVar12 = uVar12 + 1;
      } while (bVar2);
      bVar7 = true;
LAB_001e2786:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_p != local_68) {
        operator_delete(local_78._M_p,local_68[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_p != &local_88) {
        operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8[0]._M_p != &local_a8) {
        operator_delete(local_b8[0]._M_p,local_a8._M_allocated_capacity + 1);
      }
    }
    local_128._vptr_Finder = (_func_int **)&PTR__QPDFWordTokenFinder_002ee160;
    if (local_118[0] != local_108) {
      operator_delete(local_118[0],local_108[0] + 1);
    }
  } while (bVar6);
  (*input->_vptr_InputSource[5])(input,CONCAT44(extraout_var,iVar8),0);
  InputSource::setLastOffset(input,local_f8);
  return;
}

Assistant:

void
Tokenizer::findEI(InputSource& input)
{
    qpdf_offset_t last_offset = input.getLastOffset();
    qpdf_offset_t pos = input.tell();

    // Use QPDFWordTokenFinder to find EI surrounded by delimiters. Then read the next several
    // tokens or up to EOF. If we find any suspicious-looking or tokens, this is probably still part
    // of the image data, so keep looking for EI. Stop at the first EI that passes. If we get to the
    // end without finding one, return the last EI we found. Store the number of bytes expected in
    // the inline image including the EI and use that to break out of inline image, falling back to
    // the old method if needed.

    bool okay = false;
    bool first_try = true;
    while (!okay) {
        QPDFWordTokenFinder f(input, "EI");
        if (!input.findFirst("EI", input.tell(), 0, f)) {
            break;
        }
        inline_image_bytes = QIntC::to_size(input.tell() - pos - 2);

        Tokenizer check;
        bool found_bad = false;
        // Look at the next 10 tokens or up to EOF. The next inline image's image data would look
        // like bad tokens, but there will always be at least 10 tokens between one inline image's
        // EI and the next valid one's ID since width, height, bits per pixel, and color space are
        // all required as well as a BI and ID. If we get 10 good tokens in a row or hit EOF, we can
        // be pretty sure we've found the actual EI.
        for (int i = 0; i < 10; ++i) {
            check.nextToken(input, "checker");
            auto typ = check.getType();
            if (typ == tt::tt_eof) {
                okay = true;
            } else if (typ == tt::tt_bad) {
                found_bad = true;
            } else if (typ == tt::tt_word) {
                // The qpdf tokenizer lumps alphabetic and otherwise uncategorized characters into
                // "words". We recognize strings of alphabetic characters as potential valid
                // operators for purposes of telling whether we're in valid content or not. It's not
                // perfect, but it should work more reliably than what we used to do, which was
                // already good enough for the vast majority of files.
                bool found_alpha = false;
                bool found_non_printable = false;
                bool found_other = false;
                for (char ch: check.getValue()) {
                    if ((ch >= 'a' && ch <= 'z') || (ch >= 'A' && ch <= 'Z') || (ch == '*')) {
                        // Treat '*' as alpha since there are valid PDF operators that contain *
                        // along with alphabetic characters.
                        found_alpha = true;
                    } else if (static_cast<signed char>(ch) < 32 && !isSpace(ch)) {
                        // Compare ch as a signed char so characters outside of 7-bit will be < 0.
                        found_non_printable = true;
                        break;
                    } else {
                        found_other = true;
                    }
                }
                if (found_non_printable || (found_alpha && found_other)) {
                    found_bad = true;
                }
            }
            if (okay || found_bad) {
                break;
            }
        }
        if (!found_bad) {
            okay = true;
        }
        if (!okay) {
            first_try = false;
        }
    }
    if (okay && (!first_try)) {
        QTC::TC("qpdf", "QPDFTokenizer found EI after more than one try");
    }

    input.seek(pos, SEEK_SET);
    input.setLastOffset(last_offset);
}